

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O2

void __thiscall
session::send_lambda::operator()
          (send_lambda *this,
          message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>
          *msg)

{
  session *__r;
  element_type *msg_00;
  shared_ptr<boost::beast::http::message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  sp;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  __shared_ptr<boost::beast::http::message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_50;
  bind_front_wrapper<void_(session::*)(bool,_boost::system::error_code,_unsigned_long),_std::shared_ptr<session>,_bool>
  local_40;
  
  std::
  make_shared<boost::beast::http::message<false,boost::beast::http::empty_body,boost::beast::http::basic_fields<std::allocator<char>>>,boost::beast::http::message<false,boost::beast::http::empty_body,boost::beast::http::basic_fields<std::allocator<char>>>>
            ((message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>
              *)&local_50);
  std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&this->self_->res_,&local_50);
  msg_00 = local_50._M_ptr;
  __r = this->self_;
  std::__shared_ptr<session,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<session,void>
            ((__shared_ptr<session,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (__weak_ptr<session,_(__gnu_cxx::_Lock_policy)2> *)__r);
  local_40.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL,_1UL>,_std::shared_ptr<session>,_bool>
  .super_tuple_element_impl<1UL,_bool>.t =
       boost::beast::http::
       message<false,_boost::beast::http::empty_body,_boost::beast::http::basic_fields<std::allocator<char>_>_>
       ::need_eof(local_50._M_ptr);
  local_40.h_ = (offset_in_session_to_subr)on_write;
  local_40._8_8_ = 0;
  local_40.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL,_1UL>,_std::shared_ptr<session>,_bool>
  .super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
  super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_68;
  local_40.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL,_1UL>,_std::shared_ptr<session>,_bool>
  .super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
  super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = a_Stack_60[0]._M_pi;
  local_68 = (element_type *)0x0;
  a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::beast::http::
  async_write<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,false,boost::beast::http::empty_body,boost::beast::http::basic_fields<std::allocator<char>>,boost::beast::detail::bind_front_wrapper<void(session::*)(bool,boost::system::error_code,unsigned_long),std::shared_ptr<session>,bool>>
            (&__r->stream_,msg_00,&local_40,(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_40.args_.
                     super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL,_1UL>,_std::shared_ptr<session>,_bool>
                     .super_tuple_element_impl<0UL,_std::shared_ptr<session>_>.t.
                     super___shared_ptr<session,_(__gnu_cxx::_Lock_policy)2> + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return;
}

Assistant:

void
        operator()(http::message<isRequest, Body, Fields>&& msg) const
        {
            // The lifetime of the message has to extend
            // for the duration of the async operation so
            // we use a shared_ptr to manage it.
            auto sp = std::make_shared<
                http::message<isRequest, Body, Fields>>(std::move(msg));

            // Store a type-erased version of the shared
            // pointer in the class to keep it alive.
            self_.res_ = sp;

            // Write the response
            http::async_write(
                self_.stream_,
                *sp,
                beast::bind_front_handler(
                    &session::on_write,
                    self_.shared_from_this(),
                    sp->need_eof()));
        }